

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::XML_CheckNode_MustHaveChildren(AMFImporter *this)

{
  uint uVar1;
  int iVar2;
  DeadlyImportError *this_00;
  undefined4 extraout_var;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  AMFImporter *local_10;
  AMFImporter *this_local;
  
  local_10 = this;
  uVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar1 & 1) == 0) {
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"Node <",&local_71);
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::operator+(&local_50,&local_70,(char *)CONCAT44(extraout_var,iVar2));
  std::operator+(&local_30,&local_50,"> must have children.");
  DeadlyImportError::DeadlyImportError(this_00,&local_30);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AMFImporter::XML_CheckNode_MustHaveChildren()
{
	if(mReader->isEmptyElement()) throw DeadlyImportError(std::string("Node <") + mReader->getNodeName() + "> must have children.");
}